

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O2

adios2_varinfo *
adios2_inquire_blockinfo(adios2_engine *engine,adios2_variable *variable,size_t step)

{
  int *piVar1;
  char cVar2;
  byte bVar3;
  undefined4 uVar4;
  int iVar5;
  void *pvVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  void *pvVar9;
  adios2_varinfo *paVar10;
  size_t sVar11;
  adios2_blockinfo *paVar12;
  size_t *psVar13;
  undefined8 *puVar14;
  void *pvVar15;
  long lVar16;
  size_t sVar17;
  long lVar18;
  bool bVar19;
  vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
  blocksInfo;
  long local_b8;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string
            ((string *)&local_50,"for adios2_engine, in call to adios2_inquire_blockinfo",
             (allocator *)&blocksInfo);
  adios2::helper::CheckForNullptr<adios2_engine>(engine,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string
            ((string *)&local_70,"for adios2_variable, in call to adios2_get",
             (allocator *)&blocksInfo);
  adios2::helper::CheckForNullptr<adios2_variable>(variable,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  uVar4 = *(undefined4 *)(variable + 0x28);
  pvVar9 = (void *)(**(code **)(*(long *)engine + 0x58))(engine,variable,step);
  if (pvVar9 == (void *)0x0) {
    switch(uVar4) {
    case 1:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<signed_char>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<signed_char>((Variable *)&blocksInfo,(ulong)engine);
      paVar10 = (adios2_varinfo *)malloc(0x28);
      lVar18 = _blocksInfo;
      sVar11 = (local_b8 - _blocksInfo) / 400;
      paVar10->nblocks = sVar11;
      paVar12 = (adios2_blockinfo *)malloc(sVar11 * 0x50);
      paVar10->BlocksInfo = paVar12;
      paVar10->Dims = (int)((ulong)(*(long *)(lVar18 + 0x38) - *(long *)(lVar18 + 0x30)) >> 3);
      psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(lVar18 + 0x30),
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
      paVar10->Shape = psVar13;
      paVar10->IsValue = (uint)*(byte *)(_blocksInfo + 0x188);
      paVar10->IsReverseDims = (uint)*(byte *)(_blocksInfo + 0x189);
      lVar18 = 0x180;
      while (bVar19 = sVar11 != 0, sVar11 = sVar11 - 1, bVar19) {
        piVar1 = (int *)(_blocksInfo + lVar18);
        paVar12->WriterID = *piVar1;
        paVar12->BlockID = *(size_t *)(piVar1 + -0x2a);
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(piVar1 + -0x4e),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Start = psVar13;
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(_blocksInfo + lVar18 + -0x120),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Count = psVar13;
        (paVar12->MinUnion).int64 = 0;
        (paVar12->MaxUnion).int64 = 0;
        (paVar12->Value).int64 = 0;
        lVar18 = lVar18 + 400;
        paVar12 = paVar12 + 1;
      }
      std::
      vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
      ::~vector(&blocksInfo);
      break;
    case 2:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<short>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<short>((Variable *)&blocksInfo,(ulong)engine);
      paVar10 = (adios2_varinfo *)malloc(0x28);
      lVar18 = _blocksInfo;
      sVar11 = (local_b8 - _blocksInfo) / 400;
      paVar10->nblocks = sVar11;
      paVar12 = (adios2_blockinfo *)malloc(sVar11 * 0x50);
      paVar10->BlocksInfo = paVar12;
      paVar10->Dims = (int)((ulong)(*(long *)(lVar18 + 0x38) - *(long *)(lVar18 + 0x30)) >> 3);
      psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(lVar18 + 0x30),
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
      paVar10->Shape = psVar13;
      paVar10->IsValue = (uint)*(byte *)(_blocksInfo + 0x188);
      paVar10->IsReverseDims = (uint)*(byte *)(_blocksInfo + 0x189);
      lVar18 = 0x180;
      while (bVar19 = sVar11 != 0, sVar11 = sVar11 - 1, bVar19) {
        piVar1 = (int *)(_blocksInfo + lVar18);
        paVar12->WriterID = *piVar1;
        paVar12->BlockID = *(size_t *)(piVar1 + -0x2a);
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(piVar1 + -0x4e),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Start = psVar13;
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(_blocksInfo + lVar18 + -0x120),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Count = psVar13;
        (paVar12->MinUnion).int64 = 0;
        (paVar12->MaxUnion).int64 = 0;
        (paVar12->Value).int64 = 0;
        lVar18 = lVar18 + 400;
        paVar12 = paVar12 + 1;
      }
      std::
      vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                 *)&blocksInfo);
      break;
    case 3:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<int>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<int>((Variable *)&blocksInfo,(ulong)engine);
      paVar10 = (adios2_varinfo *)malloc(0x28);
      lVar18 = _blocksInfo;
      sVar11 = (local_b8 - _blocksInfo) / 0x198;
      paVar10->nblocks = sVar11;
      paVar12 = (adios2_blockinfo *)malloc(sVar11 * 0x50);
      paVar10->BlocksInfo = paVar12;
      paVar10->Dims = (int)((ulong)(*(long *)(lVar18 + 0x38) - *(long *)(lVar18 + 0x30)) >> 3);
      psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(lVar18 + 0x30),
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
      paVar10->Shape = psVar13;
      paVar10->IsValue = (uint)*(byte *)(_blocksInfo + 400);
      paVar10->IsReverseDims = (uint)*(byte *)(_blocksInfo + 0x191);
      lVar18 = 0x188;
      while (bVar19 = sVar11 != 0, sVar11 = sVar11 - 1, bVar19) {
        piVar1 = (int *)(_blocksInfo + lVar18);
        paVar12->WriterID = *piVar1;
        paVar12->BlockID = *(size_t *)(piVar1 + -0x2c);
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(piVar1 + -0x50),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Start = psVar13;
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(_blocksInfo + lVar18 + -0x128),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Count = psVar13;
        (paVar12->MinUnion).int64 = 0;
        (paVar12->MaxUnion).int64 = 0;
        (paVar12->Value).int64 = 0;
        lVar18 = lVar18 + 0x198;
        paVar12 = paVar12 + 1;
      }
      std::
      vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                 *)&blocksInfo);
      break;
    case 4:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<long>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<long>((Variable *)&blocksInfo,(ulong)engine);
      paVar10 = (adios2_varinfo *)malloc(0x28);
      lVar18 = _blocksInfo;
      sVar11 = (local_b8 - _blocksInfo) / 0x1a0;
      paVar10->nblocks = sVar11;
      paVar12 = (adios2_blockinfo *)malloc(sVar11 * 0x50);
      paVar10->BlocksInfo = paVar12;
      paVar10->Dims = (int)((ulong)(*(long *)(lVar18 + 0x38) - *(long *)(lVar18 + 0x30)) >> 3);
      psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(lVar18 + 0x30),
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
      paVar10->Shape = psVar13;
      paVar10->IsValue = (uint)*(byte *)(_blocksInfo + 0x198);
      paVar10->IsReverseDims = (uint)*(byte *)(_blocksInfo + 0x199);
      lVar18 = 400;
      while (bVar19 = sVar11 != 0, sVar11 = sVar11 - 1, bVar19) {
        piVar1 = (int *)(_blocksInfo + lVar18);
        paVar12->WriterID = *piVar1;
        paVar12->BlockID = *(size_t *)(piVar1 + -0x2e);
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(piVar1 + -0x52),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Start = psVar13;
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(_blocksInfo + lVar18 + -0x130),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Count = psVar13;
        (paVar12->MinUnion).int64 = 0;
        (paVar12->MaxUnion).int64 = 0;
        (paVar12->Value).int64 = 0;
        lVar18 = lVar18 + 0x1a0;
        paVar12 = paVar12 + 1;
      }
      std::
      vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                 *)&blocksInfo);
      break;
    case 5:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<unsigned_char>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<unsigned_char>((Variable *)&blocksInfo,(ulong)engine);
      paVar10 = (adios2_varinfo *)malloc(0x28);
      lVar18 = _blocksInfo;
      sVar11 = (local_b8 - _blocksInfo) / 400;
      paVar10->nblocks = sVar11;
      paVar12 = (adios2_blockinfo *)malloc(sVar11 * 0x50);
      paVar10->BlocksInfo = paVar12;
      paVar10->Dims = (int)((ulong)(*(long *)(lVar18 + 0x38) - *(long *)(lVar18 + 0x30)) >> 3);
      psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(lVar18 + 0x30),
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
      paVar10->Shape = psVar13;
      paVar10->IsValue = (uint)*(byte *)(_blocksInfo + 0x188);
      paVar10->IsReverseDims = (uint)*(byte *)(_blocksInfo + 0x189);
      lVar18 = 0x180;
      while (bVar19 = sVar11 != 0, sVar11 = sVar11 - 1, bVar19) {
        piVar1 = (int *)(_blocksInfo + lVar18);
        paVar12->WriterID = *piVar1;
        paVar12->BlockID = *(size_t *)(piVar1 + -0x2a);
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(piVar1 + -0x4e),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Start = psVar13;
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(_blocksInfo + lVar18 + -0x120),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Count = psVar13;
        (paVar12->MinUnion).int64 = 0;
        (paVar12->MaxUnion).int64 = 0;
        (paVar12->Value).int64 = 0;
        lVar18 = lVar18 + 400;
        paVar12 = paVar12 + 1;
      }
      std::
      vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                 *)&blocksInfo);
      break;
    case 6:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<unsigned_short>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<unsigned_short>((Variable *)&blocksInfo,(ulong)engine);
      paVar10 = (adios2_varinfo *)malloc(0x28);
      lVar18 = _blocksInfo;
      sVar11 = (local_b8 - _blocksInfo) / 400;
      paVar10->nblocks = sVar11;
      paVar12 = (adios2_blockinfo *)malloc(sVar11 * 0x50);
      paVar10->BlocksInfo = paVar12;
      paVar10->Dims = (int)((ulong)(*(long *)(lVar18 + 0x38) - *(long *)(lVar18 + 0x30)) >> 3);
      psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(lVar18 + 0x30),
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
      paVar10->Shape = psVar13;
      paVar10->IsValue = (uint)*(byte *)(_blocksInfo + 0x188);
      paVar10->IsReverseDims = (uint)*(byte *)(_blocksInfo + 0x189);
      lVar18 = 0x180;
      while (bVar19 = sVar11 != 0, sVar11 = sVar11 - 1, bVar19) {
        piVar1 = (int *)(_blocksInfo + lVar18);
        paVar12->WriterID = *piVar1;
        paVar12->BlockID = *(size_t *)(piVar1 + -0x2a);
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(piVar1 + -0x4e),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Start = psVar13;
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(_blocksInfo + lVar18 + -0x120),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Count = psVar13;
        (paVar12->MinUnion).int64 = 0;
        (paVar12->MaxUnion).int64 = 0;
        (paVar12->Value).int64 = 0;
        lVar18 = lVar18 + 400;
        paVar12 = paVar12 + 1;
      }
      std::
      vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                 *)&blocksInfo);
      break;
    case 7:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<unsigned_int>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<unsigned_int>((Variable *)&blocksInfo,(ulong)engine);
      paVar10 = (adios2_varinfo *)malloc(0x28);
      lVar18 = _blocksInfo;
      sVar11 = (local_b8 - _blocksInfo) / 0x198;
      paVar10->nblocks = sVar11;
      paVar12 = (adios2_blockinfo *)malloc(sVar11 * 0x50);
      paVar10->BlocksInfo = paVar12;
      paVar10->Dims = (int)((ulong)(*(long *)(lVar18 + 0x38) - *(long *)(lVar18 + 0x30)) >> 3);
      psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(lVar18 + 0x30),
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
      paVar10->Shape = psVar13;
      paVar10->IsValue = (uint)*(byte *)(_blocksInfo + 400);
      paVar10->IsReverseDims = (uint)*(byte *)(_blocksInfo + 0x191);
      lVar18 = 0x188;
      while (bVar19 = sVar11 != 0, sVar11 = sVar11 - 1, bVar19) {
        piVar1 = (int *)(_blocksInfo + lVar18);
        paVar12->WriterID = *piVar1;
        paVar12->BlockID = *(size_t *)(piVar1 + -0x2c);
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(piVar1 + -0x50),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Start = psVar13;
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(_blocksInfo + lVar18 + -0x128),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Count = psVar13;
        (paVar12->MinUnion).int64 = 0;
        (paVar12->MaxUnion).int64 = 0;
        (paVar12->Value).int64 = 0;
        lVar18 = lVar18 + 0x198;
        paVar12 = paVar12 + 1;
      }
      std::
      vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                 *)&blocksInfo);
      break;
    case 8:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<unsigned_long>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<unsigned_long>((Variable *)&blocksInfo,(ulong)engine);
      paVar10 = (adios2_varinfo *)malloc(0x28);
      lVar18 = _blocksInfo;
      sVar11 = (local_b8 - _blocksInfo) / 0x1a0;
      paVar10->nblocks = sVar11;
      paVar12 = (adios2_blockinfo *)malloc(sVar11 * 0x50);
      paVar10->BlocksInfo = paVar12;
      paVar10->Dims = (int)((ulong)(*(long *)(lVar18 + 0x38) - *(long *)(lVar18 + 0x30)) >> 3);
      psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(lVar18 + 0x30),
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
      paVar10->Shape = psVar13;
      paVar10->IsValue = (uint)*(byte *)(_blocksInfo + 0x198);
      paVar10->IsReverseDims = (uint)*(byte *)(_blocksInfo + 0x199);
      lVar18 = 400;
      while (bVar19 = sVar11 != 0, sVar11 = sVar11 - 1, bVar19) {
        piVar1 = (int *)(_blocksInfo + lVar18);
        paVar12->WriterID = *piVar1;
        paVar12->BlockID = *(size_t *)(piVar1 + -0x2e);
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(piVar1 + -0x52),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Start = psVar13;
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(_blocksInfo + lVar18 + -0x130),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Count = psVar13;
        (paVar12->MinUnion).int64 = 0;
        (paVar12->MaxUnion).int64 = 0;
        (paVar12->Value).int64 = 0;
        lVar18 = lVar18 + 0x1a0;
        paVar12 = paVar12 + 1;
      }
      std::
      vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                 *)&blocksInfo);
      break;
    case 9:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<float>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<float>((Variable *)&blocksInfo,(ulong)engine);
      paVar10 = (adios2_varinfo *)malloc(0x28);
      lVar18 = _blocksInfo;
      sVar11 = (local_b8 - _blocksInfo) / 0x198;
      paVar10->nblocks = sVar11;
      paVar12 = (adios2_blockinfo *)malloc(sVar11 * 0x50);
      paVar10->BlocksInfo = paVar12;
      paVar10->Dims = (int)((ulong)(*(long *)(lVar18 + 0x38) - *(long *)(lVar18 + 0x30)) >> 3);
      psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(lVar18 + 0x30),
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
      paVar10->Shape = psVar13;
      paVar10->IsValue = (uint)*(byte *)(_blocksInfo + 400);
      paVar10->IsReverseDims = (uint)*(byte *)(_blocksInfo + 0x191);
      lVar18 = 0x188;
      while (bVar19 = sVar11 != 0, sVar11 = sVar11 - 1, bVar19) {
        piVar1 = (int *)(_blocksInfo + lVar18);
        paVar12->WriterID = *piVar1;
        paVar12->BlockID = *(size_t *)(piVar1 + -0x2c);
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(piVar1 + -0x50),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Start = psVar13;
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(_blocksInfo + lVar18 + -0x128),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Count = psVar13;
        (paVar12->MinUnion).int64 = 0;
        (paVar12->MaxUnion).int64 = 0;
        (paVar12->Value).int64 = 0;
        lVar18 = lVar18 + 0x198;
        paVar12 = paVar12 + 1;
      }
      std::
      vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                 *)&blocksInfo);
      break;
    case 10:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<double>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<double>((Variable *)&blocksInfo,(ulong)engine);
      paVar10 = (adios2_varinfo *)malloc(0x28);
      lVar18 = _blocksInfo;
      sVar11 = (local_b8 - _blocksInfo) / 0x1a0;
      paVar10->nblocks = sVar11;
      paVar12 = (adios2_blockinfo *)malloc(sVar11 * 0x50);
      paVar10->BlocksInfo = paVar12;
      paVar10->Dims = (int)((ulong)(*(long *)(lVar18 + 0x38) - *(long *)(lVar18 + 0x30)) >> 3);
      psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(lVar18 + 0x30),
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
      paVar10->Shape = psVar13;
      paVar10->IsValue = (uint)*(byte *)(_blocksInfo + 0x198);
      paVar10->IsReverseDims = (uint)*(byte *)(_blocksInfo + 0x199);
      lVar18 = 400;
      while (bVar19 = sVar11 != 0, sVar11 = sVar11 - 1, bVar19) {
        piVar1 = (int *)(_blocksInfo + lVar18);
        paVar12->WriterID = *piVar1;
        paVar12->BlockID = *(size_t *)(piVar1 + -0x2e);
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(piVar1 + -0x52),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Start = psVar13;
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(_blocksInfo + lVar18 + -0x130),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Count = psVar13;
        (paVar12->MinUnion).int64 = 0;
        (paVar12->MaxUnion).int64 = 0;
        (paVar12->Value).int64 = 0;
        lVar18 = lVar18 + 0x1a0;
        paVar12 = paVar12 + 1;
      }
      std::
      vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                 *)&blocksInfo);
      break;
    case 0xb:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<long_double>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<long_double>((Variable *)&blocksInfo,(ulong)engine);
      paVar10 = (adios2_varinfo *)malloc(0x28);
      lVar18 = _blocksInfo;
      sVar11 = (local_b8 - _blocksInfo) / 0x1c0;
      paVar10->nblocks = sVar11;
      paVar12 = (adios2_blockinfo *)malloc(sVar11 * 0x50);
      paVar10->BlocksInfo = paVar12;
      paVar10->Dims = (int)((ulong)(*(long *)(lVar18 + 0x38) - *(long *)(lVar18 + 0x30)) >> 3);
      psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(lVar18 + 0x30),
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
      paVar10->Shape = psVar13;
      paVar10->IsValue = (uint)*(byte *)(_blocksInfo + 0x1b8);
      paVar10->IsReverseDims = (uint)*(byte *)(_blocksInfo + 0x1b9);
      lVar18 = 0x1b0;
      while (bVar19 = sVar11 != 0, sVar11 = sVar11 - 1, bVar19) {
        piVar1 = (int *)(_blocksInfo + lVar18);
        paVar12->WriterID = *piVar1;
        paVar12->BlockID = *(size_t *)(piVar1 + -0x36);
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(piVar1 + -0x5a),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Start = psVar13;
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(_blocksInfo + lVar18 + -0x150),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Count = psVar13;
        (paVar12->MinUnion).int64 = 0;
        (paVar12->MaxUnion).int64 = 0;
        (paVar12->Value).int64 = 0;
        lVar18 = lVar18 + 0x1c0;
        paVar12 = paVar12 + 1;
      }
      std::
      vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                 *)&blocksInfo);
      break;
    case 0xc:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<std::complex<float>>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<std::complex<float>>((Variable *)&blocksInfo,(ulong)engine);
      paVar10 = (adios2_varinfo *)malloc(0x28);
      lVar18 = _blocksInfo;
      sVar11 = (local_b8 - _blocksInfo) / 0x1a0;
      paVar10->nblocks = sVar11;
      paVar12 = (adios2_blockinfo *)malloc(sVar11 * 0x50);
      paVar10->BlocksInfo = paVar12;
      paVar10->Dims = (int)((ulong)(*(long *)(lVar18 + 0x38) - *(long *)(lVar18 + 0x30)) >> 3);
      psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(lVar18 + 0x30),
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
      paVar10->Shape = psVar13;
      paVar10->IsValue = (uint)*(byte *)(_blocksInfo + 0x198);
      paVar10->IsReverseDims = (uint)*(byte *)(_blocksInfo + 0x199);
      lVar18 = 400;
      while (bVar19 = sVar11 != 0, sVar11 = sVar11 - 1, bVar19) {
        piVar1 = (int *)(_blocksInfo + lVar18);
        paVar12->WriterID = *piVar1;
        paVar12->BlockID = *(size_t *)(piVar1 + -0x2e);
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(piVar1 + -0x52),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Start = psVar13;
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(_blocksInfo + lVar18 + -0x130),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Count = psVar13;
        (paVar12->MinUnion).int64 = 0;
        (paVar12->MaxUnion).int64 = 0;
        (paVar12->Value).int64 = 0;
        lVar18 = lVar18 + 0x1a0;
        paVar12 = paVar12 + 1;
      }
      std::
      vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                 *)&blocksInfo);
      break;
    case 0xd:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<std::complex<double>>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<std::complex<double>>((Variable *)&blocksInfo,(ulong)engine);
      paVar10 = (adios2_varinfo *)malloc(0x28);
      lVar18 = _blocksInfo;
      sVar11 = (local_b8 - _blocksInfo) / 0x1b8;
      paVar10->nblocks = sVar11;
      paVar12 = (adios2_blockinfo *)malloc(sVar11 * 0x50);
      paVar10->BlocksInfo = paVar12;
      paVar10->Dims = (int)((ulong)(*(long *)(lVar18 + 0x38) - *(long *)(lVar18 + 0x30)) >> 3);
      psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(lVar18 + 0x30),
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
      paVar10->Shape = psVar13;
      paVar10->IsValue = (uint)*(byte *)(_blocksInfo + 0x1b0);
      paVar10->IsReverseDims = (uint)*(byte *)(_blocksInfo + 0x1b1);
      lVar18 = 0x1a8;
      while (bVar19 = sVar11 != 0, sVar11 = sVar11 - 1, bVar19) {
        piVar1 = (int *)(_blocksInfo + lVar18);
        paVar12->WriterID = *piVar1;
        paVar12->BlockID = *(size_t *)(piVar1 + -0x34);
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(piVar1 + -0x58),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Start = psVar13;
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(_blocksInfo + lVar18 + -0x148),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Count = psVar13;
        (paVar12->MinUnion).int64 = 0;
        (paVar12->MaxUnion).int64 = 0;
        (paVar12->Value).int64 = 0;
        lVar18 = lVar18 + 0x1b8;
        paVar12 = paVar12 + 1;
      }
      std::
      vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                 *)&blocksInfo);
      break;
    case 0xe:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<std::__cxx11::string>((Variable *)&blocksInfo,(ulong)engine);
      paVar10 = (adios2_varinfo *)malloc(0x28);
      lVar18 = _blocksInfo;
      sVar11 = (local_b8 - _blocksInfo) / 0x1e8;
      paVar10->nblocks = sVar11;
      paVar12 = (adios2_blockinfo *)malloc(sVar11 * 0x50);
      paVar10->BlocksInfo = paVar12;
      paVar10->Dims = (int)((ulong)(*(long *)(lVar18 + 0x38) - *(long *)(lVar18 + 0x30)) >> 3);
      psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(lVar18 + 0x30),
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
      paVar10->Shape = psVar13;
      paVar10->IsValue = (uint)*(byte *)(_blocksInfo + 0x1e0);
      paVar10->IsReverseDims = (uint)*(byte *)(_blocksInfo + 0x1e1);
      lVar18 = 0x128;
      while (bVar19 = sVar11 != 0, sVar11 = sVar11 - 1, bVar19) {
        lVar16 = _blocksInfo + lVar18;
        paVar12->WriterID = *(int *)(lVar16 + 0xb0);
        paVar12->BlockID = *(size_t *)(lVar16 + -0x50);
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(lVar16 + -0xe0),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Start = psVar13;
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(_blocksInfo + lVar18 + -200),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Count = psVar13;
        (paVar12->MinUnion).int64 = 0;
        (paVar12->MaxUnion).int64 = 0;
        (paVar12->Value).int64 = *(int64_t *)(_blocksInfo + lVar18);
        lVar18 = lVar18 + 0x1e8;
        paVar12 = paVar12 + 1;
      }
      std::
      vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                 *)&blocksInfo);
      break;
    case 0xf:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<char>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<char>((Variable *)&blocksInfo,(ulong)engine);
      paVar10 = (adios2_varinfo *)malloc(0x28);
      lVar18 = _blocksInfo;
      sVar11 = (local_b8 - _blocksInfo) / 400;
      paVar10->nblocks = sVar11;
      paVar12 = (adios2_blockinfo *)malloc(sVar11 * 0x50);
      paVar10->BlocksInfo = paVar12;
      paVar10->Dims = (int)((ulong)(*(long *)(lVar18 + 0x38) - *(long *)(lVar18 + 0x30)) >> 3);
      psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(lVar18 + 0x30),
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
      paVar10->Shape = psVar13;
      paVar10->IsValue = (uint)*(byte *)(_blocksInfo + 0x188);
      paVar10->IsReverseDims = (uint)*(byte *)(_blocksInfo + 0x189);
      lVar18 = 0x180;
      while (bVar19 = sVar11 != 0, sVar11 = sVar11 - 1, bVar19) {
        piVar1 = (int *)(_blocksInfo + lVar18);
        paVar12->WriterID = *piVar1;
        paVar12->BlockID = *(size_t *)(piVar1 + -0x2a);
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(piVar1 + -0x4e),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Start = psVar13;
        psVar13 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(_blocksInfo + lVar18 + -0x120),
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)engine);
        paVar12->Count = psVar13;
        (paVar12->MinUnion).int64 = 0;
        (paVar12->MaxUnion).int64 = 0;
        (paVar12->Value).int64 = 0;
        lVar18 = lVar18 + 400;
        paVar12 = paVar12 + 1;
      }
      std::
      vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                 *)&blocksInfo);
      break;
    default:
      paVar10 = (adios2_varinfo *)0x0;
    }
  }
  else {
    paVar10 = (adios2_varinfo *)malloc(0x28);
    lVar18 = *(long *)((long)pvVar9 + 0x20);
    sVar17 = *(long *)((long)pvVar9 + 0x28) - lVar18;
    sVar11 = (long)sVar17 / 0x50;
    paVar10->nblocks = sVar11;
    paVar10->Shape = (size_t *)0x0;
    paVar12 = (adios2_blockinfo *)malloc(sVar17);
    paVar10->BlocksInfo = paVar12;
    iVar5 = *(int *)((long)pvVar9 + 0xc);
    paVar10->Dims = iVar5;
    cVar2 = *(char *)((long)pvVar9 + 8);
    if (cVar2 == '\x01') {
      psVar13 = (size_t *)malloc(8);
      paVar10->Shape = psVar13;
      *psVar13 = *(size_t *)((long)pvVar9 + 0x10);
    }
    else {
      pvVar6 = *(void **)((long)pvVar9 + 0x10);
      if (pvVar6 != (void *)0x0) {
        sVar17 = (long)iVar5 * 8;
        psVar13 = (size_t *)malloc(sVar17);
        paVar10->Shape = psVar13;
        memcpy(psVar13,pvVar6,sVar17);
      }
    }
    bVar3 = *(byte *)((long)pvVar9 + 0x18);
    paVar10->IsValue = (uint)bVar3;
    paVar10->IsReverseDims = (uint)*(byte *)((long)pvVar9 + 0x19);
    sVar17 = (long)iVar5 << 3;
    lVar16 = 0;
    while (bVar19 = sVar11 != 0, sVar11 = sVar11 - 1, bVar19) {
      *(undefined4 *)((long)&paVar12->WriterID + lVar16) = *(undefined4 *)(lVar18 + lVar16);
      *(undefined8 *)((long)&paVar12->BlockID + lVar16) = *(undefined8 *)(lVar18 + 8 + lVar16);
      if (cVar2 == '\0') {
        puVar14 = (undefined8 *)((long)&paVar12->Start + lVar16);
        *puVar14 = 0;
        puVar14[1] = 0;
        pvVar6 = *(void **)(lVar18 + 0x10 + lVar16);
        if (pvVar6 != (void *)0x0) {
          pvVar15 = malloc(sVar17);
          *puVar14 = pvVar15;
          memcpy(pvVar15,pvVar6,sVar17);
        }
        pvVar6 = *(void **)(lVar18 + 0x18 + lVar16);
        if (pvVar6 != (void *)0x0) {
          pvVar15 = malloc(sVar17);
          *(void **)((long)&paVar12->Count + lVar16) = pvVar15;
          memcpy(pvVar15,pvVar6,sVar17);
        }
      }
      else {
        puVar14 = (undefined8 *)malloc(8);
        *(undefined8 **)((long)&paVar12->Start + lVar16) = puVar14;
        *puVar14 = *(undefined8 *)(lVar18 + 0x10 + lVar16);
        puVar14 = (undefined8 *)malloc(8);
        *(undefined8 **)((long)&paVar12->Count + lVar16) = puVar14;
        *puVar14 = *(undefined8 *)(lVar18 + 0x18 + lVar16);
      }
      if (bVar3 == 0) {
        puVar14 = (undefined8 *)(lVar18 + 0x20 + lVar16);
        uVar8 = puVar14[1];
        puVar7 = (undefined8 *)((long)&paVar12->MinUnion + lVar16);
        *puVar7 = *puVar14;
        puVar7[1] = uVar8;
        puVar14 = (undefined8 *)(lVar18 + 0x30 + lVar16);
        uVar8 = puVar14[1];
        puVar7 = (undefined8 *)((long)&paVar12->MaxUnion + lVar16);
        *puVar7 = *puVar14;
        puVar7[1] = uVar8;
      }
      else {
        puVar7 = *(undefined8 **)(lVar18 + 0x40 + lVar16);
        uVar8 = puVar7[1];
        puVar14 = (undefined8 *)((long)&paVar12->Value + lVar16);
        *puVar14 = *puVar7;
        puVar14[1] = uVar8;
      }
      lVar16 = lVar16 + 0x50;
    }
    std::_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::~_Vector_base
              ((_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
               ((long)pvVar9 + 0x20));
    operator_delete(pvVar9);
  }
  return paVar10;
}

Assistant:

adios2_varinfo *adios2_inquire_blockinfo(adios2_engine *engine, adios2_variable *variable,
                                         const size_t step)
{
    auto lf_CopyDims = [](const std::vector<size_t> &dims) -> size_t * {
        size_t *a = nullptr;
        size_t ndims = dims.size();
        if (ndims > 0)
        {
            a = (size_t *)malloc(dims.size() * sizeof(size_t));
            std::memcpy(a, dims.data(), dims.size() * sizeof(size_t));
        }
        return a;
    };

    adios2_varinfo *varinfo = NULL;

    try
    {
        adios2::helper::CheckForNullptr(engine,
                                        "for adios2_engine, in call to adios2_inquire_blockinfo");

        adios2::core::Engine *engineCpp = reinterpret_cast<adios2::core::Engine *>(engine);

        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call "
                                                  "to adios2_get");

        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);

        const adios2::DataType type(variableBase->m_Type);

        const auto minBlocksInfo = engineCpp->MinBlocksInfo(*variableBase, step);

        if (minBlocksInfo)
        {
            varinfo = (adios2_varinfo *)malloc(sizeof(adios2_varinfo));
            varinfo->nblocks = minBlocksInfo->BlocksInfo.size();
            varinfo->Shape = NULL;
            varinfo->BlocksInfo =
                (adios2_blockinfo *)malloc(varinfo->nblocks * sizeof(adios2_blockinfo));
            auto *b = varinfo->BlocksInfo;

            varinfo->Dims = minBlocksInfo->Dims;
            if (minBlocksInfo->WasLocalValue)
            {
                varinfo->Shape = (size_t *)malloc(sizeof(size_t));
                varinfo->Shape[0] = (intptr_t)minBlocksInfo->Shape;
            }
            else
            {
                if (minBlocksInfo->Shape)
                {
                    varinfo->Shape = (size_t *)malloc(sizeof(size_t) * minBlocksInfo->Dims);
                    memcpy(varinfo->Shape, minBlocksInfo->Shape,
                           sizeof(size_t) * minBlocksInfo->Dims);
                }
            }
            varinfo->IsValue = (int)minBlocksInfo->IsValue;
            varinfo->IsReverseDims = (int)minBlocksInfo->IsReverseDims;
            for (size_t i = 0; i < varinfo->nblocks; ++i)
            {
                b[i].WriterID = minBlocksInfo->BlocksInfo[i].WriterID;
                b[i].BlockID = minBlocksInfo->BlocksInfo[i].BlockID;
                if (minBlocksInfo->WasLocalValue)
                {
                    b[i].Start = (size_t *)malloc(sizeof(size_t));
                    b[i].Start[0] = (intptr_t)minBlocksInfo->BlocksInfo[i].Start;
                    b[i].Count = (size_t *)malloc(sizeof(size_t));
                    b[i].Count[0] = (intptr_t)minBlocksInfo->BlocksInfo[i].Count;
                }
                else
                {
                    b[i].Start = b[i].Count = NULL;
                    if (minBlocksInfo->BlocksInfo[i].Start)
                    {
                        b[i].Start = (size_t *)malloc(sizeof(size_t) * minBlocksInfo->Dims);
                        memcpy(b[i].Start, minBlocksInfo->BlocksInfo[i].Start,
                               sizeof(size_t) * minBlocksInfo->Dims);
                    }
                    if (minBlocksInfo->BlocksInfo[i].Count)
                    {
                        b[i].Count = (size_t *)malloc(sizeof(size_t) * minBlocksInfo->Dims);
                        memcpy(b[i].Count, minBlocksInfo->BlocksInfo[i].Count,
                               sizeof(size_t) * minBlocksInfo->Dims);
                    }
                }
                if (minBlocksInfo->IsValue)
                {
                    memcpy(&b[i].Value, minBlocksInfo->BlocksInfo[i].BufferP, sizeof(b[i].Value));
                }
                else
                {
                    memcpy(&b[i].MinUnion, &minBlocksInfo->BlocksInfo[i].MinMax.MinUnion,
                           sizeof(b[i].MinUnion));
                    memcpy(&b[i].MaxUnion, &minBlocksInfo->BlocksInfo[i].MinMax.MaxUnion,
                           sizeof(b[i].MaxUnion));
                }
            }
            delete minBlocksInfo;
            return varinfo;
        }

        /* Call the big gun Engine::BlocksInfo<T> */
        if (type == adios2::DataType::Struct)
        {
            return varinfo;
        }
        else if (type == adios2::helper::GetDataType<std::string>())
        {
            const auto blocksInfo = engineCpp->BlocksInfo<std::string>(
                *dynamic_cast<adios2::core::Variable<std::string> *>(variableBase), step);
            varinfo = (adios2_varinfo *)malloc(sizeof(adios2_varinfo));
            varinfo->nblocks = blocksInfo.size();
            varinfo->BlocksInfo =
                (adios2_blockinfo *)malloc(varinfo->nblocks * sizeof(adios2_blockinfo));
            auto *b = varinfo->BlocksInfo;

            varinfo->Dims = static_cast<int>(blocksInfo[0].Shape.size());
            varinfo->Shape = lf_CopyDims(blocksInfo[0].Shape);
            varinfo->IsValue = (int)blocksInfo[0].IsValue;
            varinfo->IsReverseDims = (int)blocksInfo[0].IsReverseDims;
            for (size_t i = 0; i < varinfo->nblocks; ++i)
            {
                b[i].WriterID = blocksInfo[i].WriterID;
                b[i].BlockID = blocksInfo[i].BlockID;
                b[i].Start = lf_CopyDims(blocksInfo[i].Start);
                b[i].Count = lf_CopyDims(blocksInfo[i].Count);
                // minBlocksInfo->BlocksInfo[i].MinUnion;
                b[i].MinUnion.uint64 = 0;
                // minBlocksInfo->BlocksInfo[i].MaxUnion;
                b[i].MaxUnion.uint64 = 0;
                b[i].Value.str = (char *)blocksInfo[i].Value.data();
            };
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        const auto blocksInfo = engineCpp->BlocksInfo<T>(                                          \
            *dynamic_cast<adios2::core::Variable<T> *>(variableBase), step);                       \
        varinfo = (adios2_varinfo *)malloc(sizeof(adios2_varinfo));                                \
        varinfo->nblocks = blocksInfo.size();                                                      \
        varinfo->BlocksInfo =                                                                      \
            (adios2_blockinfo *)malloc(varinfo->nblocks * sizeof(adios2_blockinfo));               \
        auto *b = varinfo->BlocksInfo;                                                             \
                                                                                                   \
        varinfo->Dims = static_cast<int>(blocksInfo[0].Shape.size());                              \
        varinfo->Shape = lf_CopyDims(blocksInfo[0].Shape);                                         \
        varinfo->IsValue = (int)blocksInfo[0].IsValue;                                             \
        varinfo->IsReverseDims = (int)blocksInfo[0].IsReverseDims;                                 \
        for (size_t i = 0; i < varinfo->nblocks; ++i)                                              \
        {                                                                                          \
            b[i].WriterID = blocksInfo[i].WriterID;                                                \
            b[i].BlockID = blocksInfo[i].BlockID;                                                  \
            b[i].Start = lf_CopyDims(blocksInfo[i].Start);                                         \
            b[i].Count = lf_CopyDims(blocksInfo[i].Count);                                         \
            b[i].MinUnion.uint64 = 0;                                                              \
            b[i].MaxUnion.uint64 = 0;                                                              \
            b[i].Value.uint64 = 0;                                                                 \
        };                                                                                         \
    }
        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation
    }
    catch (...)
    {
        adios2::helper::ExceptionToError("adios2_inquire_blockinfo");
        return NULL;
    }
    return varinfo;
}